

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLcode Curl_SOCKS4(char *proxy_user,char *hostname,int remote_port,int sockindex,connectdata *conn
                    )

{
  int iVar1;
  timediff_t tVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  ssize_t packetsize;
  ssize_t hostnamelen;
  ssize_t written;
  ssize_t actualread;
  size_t sStack_1b8;
  int result;
  size_t plen;
  sockaddr_in *saddr_in;
  char buf [64];
  Curl_addrinfo *pCStack_158;
  int rc;
  Curl_addrinfo *hp;
  Curl_dns_entry *dns;
  Curl_easy *data;
  curl_socket_t sock;
  CURLcode code;
  uchar socksreq [262];
  _Bool protocol4a;
  connectdata *conn_local;
  int sockindex_local;
  int remote_port_local;
  char *hostname_local;
  char *proxy_user_local;
  
  socksreq[0xff] = (conn->socks_proxy).proxytype == CURLPROXY_SOCKS4A;
  data._0_4_ = conn->sock[sockindex];
  dns = (Curl_dns_entry *)conn->data;
  unique0x100004f2 = conn;
  tVar2 = Curl_timeleft((Curl_easy *)dns,(curltime *)0x0,true);
  if (tVar2 < 0) {
    Curl_failf((Curl_easy *)dns,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if (((stack0xffffffffffffffd0->bits).httpproxy & 1U) != 0) {
    pcVar6 = "";
    if ((socksreq[0xff] & 1) != 0) {
      pcVar6 = "a";
    }
    Curl_infof(stack0xffffffffffffffd0->data,"SOCKS4%s: connecting to HTTP proxy %s port %d\n",
               pcVar6,hostname,(ulong)(uint)remote_port);
  }
  curlx_nonblock((curl_socket_t)data,0);
  Curl_infof((Curl_easy *)dns,"SOCKS4 communication to %s:%d\n",hostname,(ulong)(uint)remote_port);
  sock._0_1_ = '\x04';
  sock._1_1_ = 1;
  sock._2_1_ = (undefined1)((uint)remote_port >> 8);
  sock._3_1_ = (undefined1)remote_port;
  if ((socksreq[0xff] & 1) == 0) {
    pCStack_158 = (Curl_addrinfo *)0x0;
    iVar1 = Curl_resolv(stack0xffffffffffffffd0,hostname,remote_port,(Curl_dns_entry **)&hp);
    if (iVar1 == -1) {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    if (hp != (Curl_addrinfo *)0x0) {
      pCStack_158 = *(Curl_addrinfo **)hp;
    }
    if (pCStack_158 != (Curl_addrinfo *)0x0) {
      Curl_printable_address(pCStack_158,(char *)&saddr_in,0x40);
      if (pCStack_158->ai_family == 2) {
        plen = (size_t)pCStack_158->ai_addr;
        code._0_1_ = ((sockaddr *)plen)->sa_data[2];
        code._1_1_ = ((sockaddr *)plen)->sa_data[3];
        code._2_1_ = ((sockaddr *)plen)->sa_data[4];
        code._3_1_ = ((sockaddr *)plen)->sa_data[5];
        Curl_infof((Curl_easy *)dns,"SOCKS4 connect to IPv4 %s (locally resolved)\n",&saddr_in);
      }
      else {
        pCStack_158 = (Curl_addrinfo *)0x0;
        Curl_failf((Curl_easy *)dns,"SOCKS4 connection to %s not supported\n",&saddr_in);
      }
      Curl_resolv_unlock((Curl_easy *)dns,(Curl_dns_entry *)hp);
    }
    if (pCStack_158 == (Curl_addrinfo *)0x0) {
      Curl_failf((Curl_easy *)dns,"Failed to resolve \"%s\" for SOCKS4 connect.",hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }
  socksreq[0] = '\0';
  if (proxy_user != (char *)0x0) {
    sStack_1b8 = strlen(proxy_user);
    if (0xfd < sStack_1b8) {
      Curl_failf((Curl_easy *)dns,"Too long SOCKS proxy name, can\'t use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    memcpy(socksreq,proxy_user,sStack_1b8 + 1);
  }
  packetsize = 0;
  sVar3 = strlen((char *)socksreq);
  lVar4 = sVar3 + 9;
  if ((socksreq[0xff] & 1) != 0) {
    code._0_1_ = CURLE_OK;
    code._1_1_ = CURLE_OK >> 8;
    code._2_1_ = CURLE_OK >> 0x10;
    code._3_1_ = 1;
    sVar5 = strlen(hostname);
    packetsize = sVar5 + 1;
    if (lVar4 + packetsize < 0x107) {
      strcpy((char *)(socksreq + sVar3 + 1),hostname);
    }
    else {
      packetsize = 0;
    }
  }
  data._4_4_ = Curl_write_plain(stack0xffffffffffffffd0,(curl_socket_t)data,&sock,lVar4 + packetsize
                                ,&hostnamelen);
  if ((data._4_4_ == CURLE_OK) && (hostnamelen == lVar4 + packetsize)) {
    if (((socksreq[0xff] & 1) != 0) && (packetsize == 0)) {
      sVar3 = strlen(hostname);
      data._4_4_ = Curl_write_plain(stack0xffffffffffffffd0,(curl_socket_t)data,hostname,sVar3 + 1,
                                    &hostnamelen);
      if ((data._4_4_ != CURLE_OK) || (hostnamelen != sVar3 + 1)) {
        Curl_failf((Curl_easy *)dns,"Failed to send SOCKS4 connect request.");
        return CURLE_COULDNT_CONNECT;
      }
    }
    data._4_4_ = 0;
    actualread._4_4_ =
         Curl_blockread_all(stack0xffffffffffffffd0,(curl_socket_t)data,(char *)&sock,8,&written);
    if ((actualread._4_4_ == 0) && (written == 8)) {
      if ((char)sock == '\0') {
        switch(sock._1_1_) {
        case 0x5a:
          pcVar6 = "";
          if ((socksreq[0xff] & 1) != 0) {
            pcVar6 = "a";
          }
          Curl_infof((Curl_easy *)dns,"SOCKS4%s request granted.\n",pcVar6);
          curlx_nonblock((curl_socket_t)data,1);
          proxy_user_local._4_4_ = CURLE_OK;
          break;
        case 0x5b:
          Curl_failf((Curl_easy *)dns,
                     "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                     ,(ulong)(byte)(undefined1)code,(ulong)(byte)code._1_1_,(ulong)(byte)code._2_1_,
                     (ulong)(byte)code._3_1_,(uint)CONCAT11(sock._2_1_,sock._3_1_),(uint)sock._1_1_)
          ;
          proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
          break;
        case 0x5c:
          Curl_failf((Curl_easy *)dns,
                     "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                     ,(ulong)(byte)(undefined1)code,(ulong)(byte)code._1_1_,(ulong)(byte)code._2_1_,
                     (ulong)(byte)code._3_1_,(uint)CONCAT11(sock._2_1_,sock._3_1_),(uint)sock._1_1_)
          ;
          proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
          break;
        case 0x5d:
          Curl_failf((Curl_easy *)dns,
                     "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                     ,(ulong)(byte)(undefined1)code,(ulong)(byte)code._1_1_,(ulong)(byte)code._2_1_,
                     (ulong)(byte)code._3_1_,(uint)CONCAT11(sock._2_1_,sock._3_1_),(uint)sock._1_1_)
          ;
          proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
          break;
        default:
          Curl_failf((Curl_easy *)dns,
                     "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                     (ulong)(byte)(undefined1)code,(ulong)(byte)code._1_1_,(ulong)(byte)code._2_1_,
                     (ulong)(byte)code._3_1_,(uint)CONCAT11(sock._2_1_,sock._3_1_),(uint)sock._1_1_)
          ;
          proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
        }
      }
      else {
        Curl_failf((Curl_easy *)dns,"SOCKS4 reply has wrong version, version should be 4.");
        proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
      }
    }
    else {
      Curl_failf((Curl_easy *)dns,"Failed to receive SOCKS4 connect request ack.");
      proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
    }
  }
  else {
    Curl_failf((Curl_easy *)dns,"Failed to send SOCKS4 connect request.");
    proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
  }
  return proxy_user_local._4_4_;
}

Assistant:

CURLcode Curl_SOCKS4(const char *proxy_user,
                     const char *hostname,
                     int remote_port,
                     int sockindex,
                     struct connectdata *conn)
{
  const bool protocol4a =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS4A) ? TRUE : FALSE;
#define SOCKS4REQLEN 262
  unsigned char socksreq[SOCKS4REQLEN]; /* room for SOCKS4 request incl. user
                                           id */
  CURLcode code;
  curl_socket_t sock = conn->sock[sockindex];
  struct Curl_easy *data = conn->data;

  if(Curl_timeleft(data, NULL, TRUE) < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(conn->bits.httpproxy)
    infof(conn->data, "SOCKS4%s: connecting to HTTP proxy %s port %d\n",
          protocol4a ? "a" : "", hostname, remote_port);

  (void)curlx_nonblock(sock, FALSE);

  infof(data, "SOCKS4 communication to %s:%d\n", hostname, remote_port);

  /*
   * Compose socks4 request
   *
   * Request format
   *
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   * # of bytes:  1    1      2              4           variable       1
   */

  socksreq[0] = 4; /* version (SOCKS4) */
  socksreq[1] = 1; /* connect */
  socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
  socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

  /* DNS resolve only for SOCKS4, not SOCKS4a */
  if(!protocol4a) {
    struct Curl_dns_entry *dns;
    Curl_addrinfo *hp = NULL;
    int rc;

    rc = Curl_resolv(conn, hostname, remote_port, &dns);

    if(rc == CURLRESOLV_ERROR)
      return CURLE_COULDNT_RESOLVE_PROXY;

    if(rc == CURLRESOLV_PENDING)
      /* ignores the return code, but 'dns' remains NULL on failure */
      (void)Curl_resolver_wait_resolv(conn, &dns);

    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns)
      hp = dns->addr;
    if(hp) {
      char buf[64];
      Curl_printable_address(hp, buf, sizeof(buf));

      if(hp->ai_family == AF_INET) {
        struct sockaddr_in *saddr_in;

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        socksreq[4] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[0];
        socksreq[5] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[1];
        socksreq[6] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[2];
        socksreq[7] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[3];

        infof(data, "SOCKS4 connect to IPv4 %s (locally resolved)\n", buf);
      }
      else {
        hp = NULL; /* fail! */

        failf(data, "SOCKS4 connection to %s not supported\n", buf);
      }

      Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    }
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }

  /*
   * This is currently not supporting "Identification Protocol (RFC1413)".
   */
  socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
  if(proxy_user) {
    size_t plen = strlen(proxy_user);
    if(plen >= sizeof(socksreq) - 8) {
      failf(data, "Too long SOCKS proxy name, can't use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    /* copy the proxy name WITH trailing zero */
    memcpy(socksreq + 8, proxy_user, plen + 1);
  }

  /*
   * Make connection
   */
  {
    int result;
    ssize_t actualread;
    ssize_t written;
    ssize_t hostnamelen = 0;
    ssize_t packetsize = 9 +
      strlen((char *)socksreq + 8); /* size including NUL */

    /* If SOCKS4a, set special invalid IP address 0.0.0.x */
    if(protocol4a) {
      socksreq[4] = 0;
      socksreq[5] = 0;
      socksreq[6] = 0;
      socksreq[7] = 1;
      /* If still enough room in buffer, also append hostname */
      hostnamelen = (ssize_t)strlen(hostname) + 1; /* length including NUL */
      if(packetsize + hostnamelen <= SOCKS4REQLEN)
        strcpy((char *)socksreq + packetsize, hostname);
      else
        hostnamelen = 0; /* Flag: hostname did not fit in buffer */
    }

    /* Send request */
    code = Curl_write_plain(conn, sock, (char *)socksreq,
                            packetsize + hostnamelen,
                            &written);
    if(code || (written != packetsize + hostnamelen)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLE_COULDNT_CONNECT;
    }
    if(protocol4a && hostnamelen == 0) {
      /* SOCKS4a with very long hostname - send that name separately */
      hostnamelen = (ssize_t)strlen(hostname) + 1;
      code = Curl_write_plain(conn, sock, (char *)hostname, hostnamelen,
                              &written);
      if(code || (written != hostnamelen)) {
        failf(data, "Failed to send SOCKS4 connect request.");
        return CURLE_COULDNT_CONNECT;
      }
    }

    packetsize = 8; /* receive data size */

    /* Receive response */
    result = Curl_blockread_all(conn, sock, (char *)socksreq, packetsize,
                                &actualread);
    if(result || (actualread != packetsize)) {
      failf(data, "Failed to receive SOCKS4 connect request ack.");
      return CURLE_COULDNT_CONNECT;
    }

    /*
     * Response format
     *
     *     +----+----+----+----+----+----+----+----+
     *     | VN | CD | DSTPORT |      DSTIP        |
     *     +----+----+----+----+----+----+----+----+
     * # of bytes:  1    1      2              4
     *
     * VN is the version of the reply code and should be 0. CD is the result
     * code with one of the following values:
     *
     * 90: request granted
     * 91: request rejected or failed
     * 92: request rejected because SOCKS server cannot connect to
     *     identd on the client
     * 93: request rejected because the client program and identd
     *     report different user-ids
     */

    /* wrong version ? */
    if(socksreq[0] != 0) {
      failf(data,
            "SOCKS4 reply has wrong version, version should be 4.");
      return CURLE_COULDNT_CONNECT;
    }

    /* Result */
    switch(socksreq[1]) {
    case 90:
      infof(data, "SOCKS4%s request granted.\n", protocol4a?"a":"");
      break;
    case 91:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected or failed.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 92:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because SOCKS server cannot connect to "
            "identd on the client.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 93:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because the client program and identd "
            "report different user-ids.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    default:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", Unknown.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    }
  }

  (void)curlx_nonblock(sock, TRUE);

  return CURLE_OK; /* Proxy was successful! */
}